

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ForbidCrossProtocolResumptionServer_Test::TestBody
          (QUICMethodTest_ForbidCrossProtocolResumptionServer_Test *this)

{
  SSL_SESSION *session;
  int iVar1;
  SSL_METHOD *meth;
  char *message;
  char *in_R9;
  bool bVar2;
  UniquePtr<SSL> client;
  UniquePtr<SSL_CTX> client_ctx;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  UniquePtr<SSL> server;
  BIO *bio2;
  BIO *bio1;
  SSL_QUIC_METHOD quic_method;
  
  quic_method.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  quic_method.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  quic_method.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  quic_method.flush_flight = QUICMethodTest::FlushFlightCallback;
  quic_method.send_alert = QUICMethodTest::SendAlertCallback;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_sess_set_new_cb
            ((SSL_CTX *)
             (this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,SaveLastSession);
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar2 = iVar1 != 0;
  gtest_ar_.success_ = bVar2;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f80,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
LAB_001acca6:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)client_ctx._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f81,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    goto LAB_001acca6;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f83,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    goto LAB_001acca6;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f84,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    goto LAB_001acca6;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
  iVar1 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_session_reused(client_.get())","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f87,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)client_ctx._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_session_reused(server_.get())","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f88,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)client_ctx._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = (anonymous_namespace)::g_last_session == (SSL_SESSION *)0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"g_last_session","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f8b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)client_ctx._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       QUICMethodTest::ProvideHandshakeData
                 ((this->super_QUICMethodTest).client_._M_t.
                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0xffffffffffffffff);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"ProvideHandshakeData(client_.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f8c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    goto LAB_001acca6;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ =
       SSL_process_quic_post_handshake
                 ((this->super_QUICMethodTest).client_._M_t.
                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"SSL_process_quic_post_handshake(client_.get())","1",
             (int *)&gtest_ar_,(int *)&client_ctx);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client_ctx,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f8d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&client_ctx,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_ctx);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar2 = (anonymous_namespace)::g_last_session != (SSL_SESSION *)0x0;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&client_ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"g_last_session",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f8e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&client_ctx);
    goto LAB_001acca6;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  meth = (SSL_METHOD *)TLS_method();
  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&client);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"client_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&server,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f92,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (SSL_QUIC_METHOD *)0x0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           SSL_new((SSL_CTX *)
                   client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
           SSL_new((SSL_CTX *)
                   (this->super_QUICMethodTest).server_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
           client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
          client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&bio1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x30dc1c,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bio2,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1f98,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&bio2,(Message *)&bio1);
LAB_001ace7e:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bio2);
        std::__cxx11::string::~string((string *)&gtest_ar);
        local_58._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)bio1;
LAB_001acf6d:
        if ((BIO *)local_58._M_head_impl != (BIO *)0x0) {
          (*(code *)((BIO *)local_58._M_head_impl)->method->name)();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
             server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
            server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&bio1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x309a15,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&bio2,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1f99,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&bio2,(Message *)&bio1);
          goto LAB_001ace7e;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        SSL_set_connect_state
                  ((SSL *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        SSL_set_accept_state
                  ((SSL *)server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        session = (anonymous_namespace)::g_last_session;
        *(byte *)&(anonymous_namespace)::g_last_session->verify_result =
             (byte)(anonymous_namespace)::g_last_session->verify_result & 0xdf;
        SSL_set_session((SSL *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,session);
        iVar1 = BIO_new_bio_pair((BIO **)&bio1,0,(BIO **)&bio2,0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"BIO_new_bio_pair(&bio1, 0, &bio2, 0)","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fa3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
LAB_001acf54:
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          std::__cxx11::string::~string((string *)&gtest_ar);
          goto LAB_001acf6d;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        SSL_set_bio((SSL *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(BIO *)bio1,
                    (BIO *)bio1);
        SSL_set_bio((SSL *)server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(BIO *)bio2,
                    (BIO *)bio2);
        gtest_ar_.success_ =
             CompleteHandshakes((SSL *)client._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                (SSL *)server._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"CompleteHandshakes(client.get(), server.get())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fa8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          goto LAB_001acf54;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = SSL_session_reused((SSL *)client._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"SSL_session_reused(client.get())","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1faa,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((BIO *)local_58._M_head_impl != (BIO *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = SSL_session_reused((SSL *)server._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"SSL_session_reused(server.get())","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fab,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          goto LAB_001acf54;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
      goto LAB_001acf94;
    }
    testing::Message::Message((Message *)&client);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), nullptr)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&server,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f94,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001acf94:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
  return;
}

Assistant:

TEST_F(QUICMethodTest, ForbidCrossProtocolResumptionServer) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  g_last_session = nullptr;

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_sess_set_new_cb(client_ctx_.get(), SaveLastSession);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_FALSE(SSL_session_reused(client_.get()));
  EXPECT_FALSE(SSL_session_reused(server_.get()));

  // The server sent NewSessionTicket messages in the handshake.
  EXPECT_FALSE(g_last_session);
  ASSERT_TRUE(ProvideHandshakeData(client_.get()));
  EXPECT_EQ(SSL_process_quic_post_handshake(client_.get()), 1);
  ASSERT_TRUE(g_last_session);

  // Attempt a resumption with g_last_session using TLS_method.
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), nullptr));

  bssl::UniquePtr<SSL> client(SSL_new(client_ctx.get())),
      server(SSL_new(server_ctx_.get()));
  ASSERT_TRUE(client);
  ASSERT_TRUE(server);
  SSL_set_connect_state(client.get());
  SSL_set_accept_state(server.get());

  // The TLS-over-TCP client will refuse to resume with a quic session, so
  // mark is_quic = false to bypass the client check to test the server check.
  g_last_session->is_quic = false;
  SSL_set_session(client.get(), g_last_session.get());

  BIO *bio1, *bio2;
  ASSERT_TRUE(BIO_new_bio_pair(&bio1, 0, &bio2, 0));

  // SSL_set_bio takes ownership.
  SSL_set_bio(client.get(), bio1, bio1);
  SSL_set_bio(server.get(), bio2, bio2);
  ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));

  EXPECT_FALSE(SSL_session_reused(client.get()));
  EXPECT_FALSE(SSL_session_reused(server.get()));
}